

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O2

bool __thiscall Quartet::operator<(Quartet *this,Quartet *rhs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = am(this);
  iVar3 = am(rhs);
  bVar1 = true;
  if (iVar3 <= iVar2) {
    iVar2 = am(this);
    iVar3 = am(rhs);
    if (iVar2 == iVar3) {
      bVar1 = Doublet::operator<(&this->bra,&rhs->bra);
      if (bVar1) {
        return true;
      }
      bVar1 = Doublet::operator==(&this->bra,&rhs->bra);
      if (bVar1) {
        bVar1 = Doublet::operator<(&this->ket,&rhs->ket);
        if (bVar1) {
          return true;
        }
        bVar1 = Doublet::operator==(&this->ket,&rhs->ket);
        if (bVar1) {
          if (this->m < rhs->m) {
            return true;
          }
          if ((this->m == rhs->m) && (bVar1 = std::operator<(&this->tag,&rhs->tag), bVar1)) {
            return true;
          }
        }
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator<(const Quartet & rhs) const
    {
        if(am() < rhs.am())
            return true;
        else if(am() == rhs.am())
        {
            if(bra < rhs.bra)
                return true;
            else if(bra == rhs.bra)
            {
                if(ket < rhs.ket)
                    return true;
                else if(ket == rhs.ket)
                {
                    if(m < rhs.m)
                        return true;
                    else if(m == rhs.m)
                    {
                        if(tag < rhs.tag)
                            return true;
                    }
                }
            }
        }

        return false;
    }